

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O2

QString * __thiscall
QSqlTableModel::orderByClause(QString *__return_storage_ptr__,QSqlTableModel *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  QSqlDriver *pQVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_138;
  QArrayDataPointer<char16_t> local_120;
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<char16_t> local_e8;
  QStringBuilder<QString,_char16_t> local_c8;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> local_a0;
  QSqlField f;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QSqlQueryModel).field_0x8;
  f.d.d.ptr = (totally_ordered_wrapper<QSqlFieldPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
  f.val.d.data._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  f.val.d._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  f.val.d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  f.val.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QSqlRecord::field(&f,(QSqlRecord *)(lVar2 + 0x100),*(int *)(lVar2 + 0x230));
  bVar3 = QSqlField::isValid(&f);
  if (bVar3) {
    local_e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = QSqlDatabase::driver((QSqlDatabase *)(lVar2 + 0x228));
    (**(code **)(*(long *)pQVar4 + 0xa0))(&local_108,pQVar4,lVar2 + 0x298,1);
    local_c8.a.d.size = local_108.size;
    local_c8.a.d.ptr = local_108.ptr;
    local_c8.a.d.d = local_108.d;
    local_108.d = (Data *)0x0;
    local_108.ptr = (char16_t *)0x0;
    local_108.size = 0;
    local_c8.b = L'.';
    pQVar4 = QSqlDatabase::driver((QSqlDatabase *)(lVar2 + 0x228));
    QSqlField::name((QString *)&local_138,&f);
    (**(code **)(*(long *)pQVar4 + 0xa0))(&local_120,pQVar4,&local_138,0);
    QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::QStringBuilder
              (&local_a0,&local_c8,(QString *)&local_120);
    QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::convertTo<QString>
              ((QString *)&local_e8,&local_a0);
    QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
    if (*(int *)(lVar2 + 0x234) == 0) {
      QSqlQueryModelSql::asc((QString *)&local_a0,(QString *)&local_e8);
    }
    else {
      QSqlQueryModelSql::desc((QString *)&local_a0,(QString *)&local_e8);
    }
    QString::operator=((QString *)&local_e8,(QString *)&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
    QSqlQueryModelSql::orderBy(__return_storage_ptr__,(QString *)&local_e8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  QSqlField::~QSqlField(&f);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSqlTableModel::orderByClause() const
{
    Q_D(const QSqlTableModel);
    QSqlField f = d->rec.field(d->sortColumn);
    if (!f.isValid())
        return QString();

    //we can safely escape the field because it would have been obtained from the database
    //and have the correct case
    QString field = d->db.driver()->escapeIdentifier(d->tableName, QSqlDriver::TableName)
            + u'.'
            + d->db.driver()->escapeIdentifier(f.name(), QSqlDriver::FieldName);
    field = d->sortOrder == Qt::AscendingOrder ? SqlTm::asc(field) : SqlTm::desc(field);
    return SqlTm::orderBy(field);
}